

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O3

void test_61(QPDF *pdf,char *arg2)

{
  long lVar1;
  ExtendNameTree *this;
  Pl_Discard pd;
  BufferInputSource b;
  QPDFObjectHandle QStack_1a8;
  long *local_198 [2];
  long local_188 [4];
  long *local_168 [2];
  long local_158 [2];
  long *local_148 [2];
  long local_138 [2];
  long *local_128 [2];
  long local_118 [2];
  BufferInputSource local_108 [232];
  
  QPDF::setAttemptRecovery(SUB81(pdf,0));
  QPDF::setSuppressWarnings(SUB81(pdf,0));
  QPDF::processMemoryFile((char *)pdf,"empty",0x14883c,(char *)0x0);
  QUtil::safe_fopen("/does/not/exist","r");
  QUtil::int_to_string_base_abi_cxx11_((longlong)local_128,0,0xc);
  if (local_128[0] != local_118) {
    operator_delete(local_128[0],local_118[0] + 1);
  }
  QUtil::toUTF8_abi_cxx11_((ulong)local_148);
  if (local_148[0] != local_138) {
    operator_delete(local_148[0],local_138[0] + 1);
  }
  local_198[0] = local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"x","");
  local_168[0] = local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"y","");
  BufferInputSource::BufferInputSource(local_108,(string *)local_198,(string *)local_168);
  if (local_168[0] != local_158) {
    operator_delete(local_168[0],local_158[0] + 1);
  }
  if (local_198[0] != local_188) {
    operator_delete(local_198[0],local_188[0] + 1);
  }
  lVar1 = __dynamic_cast(local_108,&InputSource::typeinfo,&BufferInputSource::typeinfo,0);
  if (lVar1 != 0) {
    Pl_Discard::Pl_Discard((Pl_Discard *)local_198);
    lVar1 = __dynamic_cast(local_198,&Pipeline::typeinfo,&Pl_Discard::typeinfo,0);
    if (lVar1 != 0) {
      this = (ExtendNameTree *)operator_new(0x38);
      QPDFObjectHandle::newNull();
      ExtendNameTree::ExtendNameTree(this,&QStack_1a8,pdf);
      if (QStack_1a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (QStack_1a8.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      (**(code **)(*(long *)this + 8))(this);
      Pl_Discard::~Pl_Discard((Pl_Discard *)local_198);
      BufferInputSource::~BufferInputSource(local_108);
      return;
    }
    __assert_fail("dynamic_cast<Pl_Discard*>(p) != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x8e0,"void test_61(QPDF &, const char *)");
  }
  __assert_fail("dynamic_cast<BufferInputSource*>(is) != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc",
                0x8dd,"void test_61(QPDF &, const char *)");
}

Assistant:

static void
test_61(QPDF& pdf, char const* arg2)
{
    // Test to make sure type information is passed across shared
    // library boundaries. This includes exception handling, dynamic
    // cast, and subclassing.
    pdf.setAttemptRecovery(false);
    pdf.setSuppressWarnings(true);
    try {
        pdf.processMemoryFile("empty", "", 0);
    } catch (QPDFExc const&) {
        std::cout << "Caught QPDFExc as expected" << std::endl;
    }
    try {
        QUtil::safe_fopen("/does/not/exist", "r");
    } catch (QPDFSystemError const&) {
        std::cout << "Caught QPDFSystemError as expected" << std::endl;
    }
    try {
        QUtil::int_to_string_base(0, 12);
    } catch (std::logic_error const&) {
        std::cout << "Caught logic_error as expected" << std::endl;
    }
    try {
        QUtil::toUTF8(0xffffffff);
    } catch (std::runtime_error const&) {
        std::cout << "Caught runtime_error as expected" << std::endl;
    }

    // Spot check RTTI for dynamic cast. We intend to have pipelines
    // and input sources be testable, but adding comprehensive tests
    // for everything doesn't add value as it wouldn't catch
    // forgetting QPDF_DLL_CLASS on a new subclass.
    BufferInputSource b("x", "y");
    InputSource* is = &b;
    assert(dynamic_cast<BufferInputSource*>(is) != nullptr);
    Pl_Discard pd;
    Pipeline* p = &pd;
    assert(dynamic_cast<Pl_Discard*>(p) != nullptr);

    // For some reason, QPDFNameTreeObjectHelper's vtable seems to
    // like to not make it into the shared library with mingw. Try to
    // make sure this is really fixed.
    QPDFNameTreeObjectHelper* n = new ExtendNameTree(QPDFObjectHandle::newNull(), pdf);
    delete n;
}